

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::PrintPresetVariables(cmake *this)

{
  bool bVar1;
  bool bVar2;
  reference ppVar3;
  ulong uVar4;
  CacheVariable *pCVar5;
  ostream *poVar6;
  string *psVar7;
  CacheEntryType local_3c;
  CacheEntryType type;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>
  *var;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  *__range1;
  bool first;
  cmake *this_local;
  
  bVar1 = true;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
           ::begin(&this->UnprocessedPresetVariables);
  var = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
           ::end(&this->UnprocessedPresetVariables);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&var), bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>
             ::operator*(&__end1);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&ppVar3->second);
    if (bVar2) {
      local_3c = UNINITIALIZED;
      std::optional<cmCMakePresetsGraph::CacheVariable>::operator->(&ppVar3->second);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        pCVar5 = std::optional<cmCMakePresetsGraph::CacheVariable>::operator->(&ppVar3->second);
        local_3c = cmState::StringToCacheEntryType(&pCVar5->Type);
      }
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,"Preset CMake variables:\n\n");
        bVar1 = false;
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"  ");
      std::operator<<(poVar6,(string *)ppVar3);
      if (local_3c != UNINITIALIZED) {
        poVar6 = std::operator<<((ostream *)&std::cout,':');
        psVar7 = cmState::CacheEntryTypeToString_abi_cxx11_(local_3c);
        std::operator<<(poVar6,(string *)psVar7);
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"=\"");
      pCVar5 = std::optional<cmCMakePresetsGraph::CacheVariable>::operator->(&ppVar3->second);
      poVar6 = std::operator<<(poVar6,(string *)&pCVar5->Value);
      std::operator<<(poVar6,"\"\n");
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>
    ::operator++(&__end1);
  }
  if (!bVar1) {
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  ::clear(&this->UnprocessedPresetVariables);
  return;
}

Assistant:

void cmake::PrintPresetVariables()
{
  bool first = true;
  for (auto const& var : this->UnprocessedPresetVariables) {
    if (!var.second) {
      continue;
    }
    cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
    if (!var.second->Type.empty()) {
      type = cmState::StringToCacheEntryType(var.second->Type);
    }
    if (first) {
      std::cout << "Preset CMake variables:\n\n";
      first = false;
    }
    std::cout << "  " << var.first;
    if (type != cmStateEnums::UNINITIALIZED) {
      std::cout << ':' << cmState::CacheEntryTypeToString(type);
    }
    std::cout << "=\"" << var.second->Value << "\"\n";
  }
  if (!first) {
    std::cout << '\n';
  }
  this->UnprocessedPresetVariables.clear();
}